

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

void luaS_init(lua_State *L)

{
  global_State *pgVar1;
  TString **__s;
  TString *pTVar2;
  long lVar3;
  
  pgVar1 = L->l_G;
  lVar3 = 0;
  __s = (TString **)luaM_malloc_(L,0x400,0);
  (pgVar1->strt).hash = __s;
  memset(__s,0,0x400);
  (pgVar1->strt).size = 0x80;
  pTVar2 = internshrstr(L,"not enough memory",0x11);
  pgVar1->memerrmsg = pTVar2;
  luaC_fix(L,(GCObject *)pTVar2);
  pTVar2 = pgVar1->memerrmsg;
  do {
    *(TString **)((long)pgVar1->strcache[0] + lVar3) = pTVar2;
    *(TString **)((long)pgVar1->strcache[0] + lVar3 + 8) = pTVar2;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x350);
  return;
}

Assistant:

void luaS_init (lua_State *L) {
  global_State *g = G(L);
  int i, j;
  stringtable *tb = &G(L)->strt;
  tb->hash = luaM_newvector(L, MINSTRTABSIZE, TString*);
  tablerehash(tb->hash, 0, MINSTRTABSIZE);  /* clear array */
  tb->size = MINSTRTABSIZE;
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaC_fix(L, obj2gco(g->memerrmsg));  /* it should never be collected */
  for (i = 0; i < STRCACHE_N; i++)  /* fill cache with valid strings */
    for (j = 0; j < STRCACHE_M; j++)
      g->strcache[i][j] = g->memerrmsg;
}